

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O2

void decompose(double *x,int N,int f,double *filter,char *type,double *trend,int *ltrend,
              double *seas,int *lseas,double *random,int *lrandom)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double *inp2;
  ulong uVar5;
  double *oup;
  void *__ptr;
  void *__ptr_00;
  long lVar6;
  ulong uVar7;
  double *pdVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  double *pdVar12;
  long lVar13;
  void *pvVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  double dVar20;
  
  lVar19 = (long)f;
  inp2 = filter;
  if (filter == (double *)0x0) {
    inp2 = (double *)malloc(lVar19 * 8);
    uVar5 = 0;
    uVar7 = 0;
    if (0 < f) {
      uVar7 = (ulong)(uint)f;
    }
    for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      inp2[uVar5] = 1.0 / (double)f;
    }
  }
  iVar2 = strcmp(type,"additive");
  if ((iVar2 == 0) && (iVar2 = strcmp(type,"multiplicative"), iVar2 == 0)) {
    puts("Type takes only either additive or multiplicative values ");
    exit(-1);
  }
  iVar2 = f / 2;
  iVar3 = N - f;
  oup = (double *)malloc((long)iVar3 * 8 + 8);
  convolve("valid","direct",x,N,inp2,f,oup);
  uVar18 = iVar3 + (f & 1U);
  __ptr = malloc((long)(int)uVar18 << 3);
  __ptr_00 = malloc(lVar19 * 8);
  iVar4 = strcmp(type,"multiplicative");
  lVar16 = (long)iVar2;
  if (iVar4 == 0) {
    for (lVar6 = 0; lVar16 + lVar6 < (long)(int)(uVar18 + iVar2); lVar6 = lVar6 + 1) {
      *(double *)((long)__ptr + lVar6 * 8) = x[lVar16 + lVar6] / oup[lVar6];
    }
  }
  else {
    iVar4 = strcmp(type,"additive");
    if (iVar4 == 0) {
      for (lVar6 = 0; lVar16 + lVar6 < (long)(int)(uVar18 + iVar2); lVar6 = lVar6 + 1) {
        *(double *)((long)__ptr + lVar6 * 8) = x[lVar16 + lVar6] - oup[lVar6];
      }
    }
  }
  uVar5 = 0;
  uVar7 = 0;
  if (0 < f) {
    uVar7 = (ulong)(uint)f;
  }
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    *(undefined8 *)((long)__ptr_00 + uVar5 * 8) = 0;
  }
  dVar20 = ceil((double)(int)uVar18 / (double)f);
  uVar1 = (int)dVar20 - 1;
  uVar5 = 0;
  uVar10 = 0;
  pvVar14 = __ptr;
  if (0 < (int)uVar1) {
    uVar10 = (ulong)uVar1;
  }
  for (; uVar5 != uVar10; uVar5 = uVar5 + 1) {
    for (uVar15 = 0; uVar7 != uVar15; uVar15 = uVar15 + 1) {
      *(double *)((long)__ptr_00 + uVar15 * 8) =
           *(double *)((long)pvVar14 + uVar15 * 8) + *(double *)((long)__ptr_00 + uVar15 * 8);
    }
    pvVar14 = (void *)((long)pvVar14 + lVar19 * 8);
  }
  uVar9 = uVar18 - uVar1 * f;
  lVar6 = (long)(int)(uVar1 * f);
  uVar5 = 0;
  uVar10 = 0;
  if (0 < (int)uVar9) {
    uVar10 = (ulong)uVar9;
  }
  for (; uVar10 != uVar5; uVar5 = uVar5 + 1) {
    *(double *)((long)__ptr_00 + uVar5 * 8) =
         (*(double *)((long)__ptr + uVar5 * 8 + lVar6 * 8) + *(double *)((long)__ptr_00 + uVar5 * 8)
         ) / (double)(int)dVar20;
  }
  for (lVar11 = (long)(int)uVar9; lVar11 < lVar19; lVar11 = lVar11 + 1) {
    *(double *)((long)__ptr_00 + lVar11 * 8) =
         *(double *)((long)__ptr_00 + lVar11 * 8) / (double)(int)uVar1;
  }
  uVar17 = f - iVar2;
  uVar5 = 0;
  uVar10 = 0;
  if (0 < (int)uVar17) {
    uVar10 = (ulong)uVar17;
  }
  for (; uVar10 != uVar5; uVar5 = uVar5 + 1) {
    seas[uVar5] = *(double *)((long)__ptr_00 + uVar5 * 8 + lVar16 * 8);
  }
  for (lVar11 = 0; (int)uVar17 + lVar11 < lVar19; lVar11 = lVar11 + 1) {
    seas[(lVar19 + lVar11) - lVar16] = *(double *)((long)__ptr_00 + (long)(int)lVar11 * 8);
  }
  pdVar12 = seas + lVar19;
  for (lVar11 = 1; pdVar8 = seas, lVar13 = lVar6, lVar11 < (int)uVar1; lVar11 = lVar11 + 1) {
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      pdVar12[uVar5] = seas[uVar5];
    }
    pdVar12 = pdVar12 + lVar19;
  }
  for (; lVar13 < (int)uVar9; lVar13 = lVar13 + 1) {
    pdVar8[lVar6] = *pdVar8;
    pdVar8 = pdVar8 + 1;
  }
  iVar4 = uVar18 - 1;
  if ((f & 1U) == 0) {
    iVar4 = iVar3;
  }
  *lseas = iVar4;
  *lrandom = iVar4;
  memcpy(trend,oup,(long)(int)uVar18 << 3);
  *ltrend = uVar18;
  iVar3 = strcmp(type,"multiplicative");
  if (iVar3 == 0) {
    for (lVar19 = 0; lVar16 + lVar19 < (long)(int)(uVar18 + iVar2); lVar19 = lVar19 + 1) {
      random[lVar19] = x[lVar16 + lVar19] / trend[lVar19];
    }
    uVar7 = 0;
    uVar5 = (ulong)uVar18;
    if ((int)uVar18 < 1) {
      uVar5 = uVar7;
    }
    for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      random[uVar7] = random[uVar7] / seas[uVar7];
    }
  }
  else {
    iVar3 = strcmp(type,"additive");
    if (iVar3 == 0) {
      for (lVar19 = 0; lVar16 + lVar19 < (long)(int)(uVar18 + iVar2); lVar19 = lVar19 + 1) {
        random[lVar19] = x[lVar16 + lVar19] - trend[lVar19];
      }
      uVar7 = 0;
      uVar5 = (ulong)uVar18;
      if ((int)uVar18 < 1) {
        uVar5 = uVar7;
      }
      for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
        random[uVar7] = random[uVar7] - seas[uVar7];
      }
    }
  }
  if (filter == (double *)0x0) {
    free(inp2);
  }
  free(oup);
  free(__ptr);
  free(__ptr_00);
  return;
}

Assistant:

void decompose(double *x,int N, int f,double *filter, const char *type, double *trend, int *ltrend, double *seas, int *lseas, double *random, int *lrandom) {
    int isOdd,i,j,f2,clen,batches;
    double *filt,*cout,*detrend,*seasonalmeans;


    isOdd = f%2;

    if (filter == NULL) {
        filt = (double*) malloc(sizeof(double) * f);
        for(i = 0; i < f;++i) {
            filt[i] = 1.0 / (double) f;
        }
    } else {
        filt = &filter[0];
    }

    if (!(strcmp(type,"additive") || strcmp(type,"multiplicative"))) {
        printf("Type takes only either additive or multiplicative values \n");
        exit(-1);
    }

    f2 = f / 2;
    clen = N - f + 1;

    cout = (double*) malloc(sizeof(double) * clen);

    convolve("valid","direct",x,N,filt,f,cout);

    //mdisplay(cout,1,clen);

    if (!isOdd) {
        clen--;
    }

    detrend = (double*) malloc(sizeof(double) * clen);
    seasonalmeans = (double*) malloc(sizeof(double) * f);

    if (!strcmp(type,"multiplicative")) {
        for(i = f2; i < clen + f2;++i) {
            detrend[i-f2] = x[i] / cout[i-f2];
        }
    } else if (!strcmp(type,"additive")) {
        for(i = f2; i < clen + f2;++i) {
            detrend[i-f2] = x[i] - cout[i-f2];
        }
    }

    //mdisplay(detrend,1,clen);

    findMeans(detrend,clen,f,seasonalmeans);

    for(i = 0; i < f-f2;++i) {
        seas[i] = seasonalmeans[f2+i];
    }

    for(i = f-f2; i < f;++i) {
        seas[i] = seasonalmeans[i-f+f2];
    }

    batches = ceil((double) clen / (double) f);

    for(i = 1; i < batches-1;++i) {
        for(j = 0; j < f;++j) {
            seas[i*f+j] =seas[j];
        }
    }
    j = 0;
    for( i = f*(batches-1); i < clen - f*(batches-1);++i) {
        seas[i] = seas[j];
        j++;
    }

    if (isOdd) {
        *lseas = clen - 1;
        *lrandom = clen - 1;
    } else {
        *lseas = clen;
        *lrandom = clen;
    }

    memcpy(trend,cout,sizeof(double)*clen);
    *ltrend = clen;

    if (!strcmp(type,"multiplicative")) {
        for(i = f2; i < clen + f2;++i) {
            random[i-f2] = x[i] / trend[i-f2];
        }
        for(i = 0; i < clen;++i) {
            random[i] = random[i] /seas[i];
        }
    } else if (!strcmp(type,"additive")) {
        for(i = f2; i < clen + f2;++i) {
            random[i-f2] = x[i] - trend[i-f2];
        }
        for(i = 0; i < clen;++i) {
            random[i] = random[i] - seas[i];
        }
    }


    if (filter == NULL) {
        free(filt);
    }

    free(cout);
    free(detrend);
    free(seasonalmeans);
}